

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneobject.cpp
# Opt level: O1

mat4 * __thiscall SceneObject::getLocalToWorld(SceneObject *this)

{
  mat4 *in_RDI;
  
  *(undefined8 *)&in_RDI->value[3].field_0 = 0;
  *(undefined8 *)((long)&in_RDI->value[3].field_0 + 8) = 0;
  *(undefined8 *)&in_RDI->value[2].field_0 = 0;
  *(undefined8 *)((long)&in_RDI->value[2].field_0 + 8) = 0;
  *(undefined8 *)&in_RDI->value[1].field_0 = 0;
  *(undefined8 *)((long)&in_RDI->value[1].field_0 + 8) = 0;
  *(undefined8 *)&in_RDI->value[0].field_0 = 0;
  *(undefined8 *)((long)&in_RDI->value[0].field_0 + 8) = 0;
  in_RDI->value[0].field_0.field_0.x = (this->localToWorld).value[0].field_0.field_0.x;
  in_RDI->value[0].field_0.field_0.y = (this->localToWorld).value[0].field_0.field_0.y;
  in_RDI->value[0].field_0.field_0.z = (this->localToWorld).value[0].field_0.field_0.z;
  in_RDI->value[0].field_0.field_0.w = (this->localToWorld).value[0].field_0.field_0.w;
  in_RDI->value[1].field_0.field_0.x = (this->localToWorld).value[1].field_0.field_0.x;
  in_RDI->value[1].field_0.field_0.y = (this->localToWorld).value[1].field_0.field_0.y;
  in_RDI->value[1].field_0.field_0.z = (this->localToWorld).value[1].field_0.field_0.z;
  in_RDI->value[1].field_0.field_0.w = (this->localToWorld).value[1].field_0.field_0.w;
  in_RDI->value[2].field_0.field_0.x = (this->localToWorld).value[2].field_0.field_0.x;
  in_RDI->value[2].field_0.field_0.y = (this->localToWorld).value[2].field_0.field_0.y;
  in_RDI->value[2].field_0.field_0.z = (this->localToWorld).value[2].field_0.field_0.z;
  in_RDI->value[2].field_0.field_0.w = (this->localToWorld).value[2].field_0.field_0.w;
  in_RDI->value[3].field_0.field_0.x = (this->localToWorld).value[3].field_0.field_0.x;
  in_RDI->value[3].field_0.field_0.y = (this->localToWorld).value[3].field_0.field_0.y;
  in_RDI->value[3].field_0.field_0.z = (this->localToWorld).value[3].field_0.field_0.z;
  in_RDI->value[3].field_0.field_0.w = (this->localToWorld).value[3].field_0.field_0.w;
  return in_RDI;
}

Assistant:

glm::mat4 SceneObject::getLocalToWorld() const {
    return localToWorld;
}